

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O0

stumpless_element * stumpless_get_element_by_index(stumpless_entry *entry,size_t index)

{
  stumpless_element *result;
  size_t index_local;
  stumpless_entry *entry_local;
  
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
    entry_local = (stumpless_entry *)0x0;
  }
  else if (index < entry->element_count) {
    clear_error();
    lock_entry(entry);
    entry_local = (stumpless_entry *)locked_get_element_by_index(entry,index);
    unlock_entry(entry);
  }
  else {
    raise_index_out_of_bounds("invalid element index",index);
    entry_local = (stumpless_entry *)0x0;
  }
  return (stumpless_element *)entry_local;
}

Assistant:

struct stumpless_element *
stumpless_get_element_by_index( const struct stumpless_entry *entry,
                                size_t index ) {
  struct stumpless_element *result;

  VALIDATE_ARG_NOT_NULL( entry );

  if( index >= entry->element_count ) {
    raise_index_out_of_bounds( L10N_INVALID_INDEX_ERROR_MESSAGE( "element" ),
                               index );
    return NULL;
  }

  clear_error(  );

  lock_entry( entry );
  result = locked_get_element_by_index( entry, index );
  unlock_entry( entry );

  return result;
}